

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

string * cm::operator+=(string *s,
                       StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *a)

{
  StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *a_local;
  string *s_local;
  
  std::__cxx11::string::size();
  StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::size(a);
  std::__cxx11::string::reserve((ulong)s);
  std::__cxx11::string::operator+=((string *)s,&a->l);
  std::__cxx11::string::operator+=((string *)s,&a->r);
  return s;
}

Assistant:

std::string& operator+=(std::string& s, StringOpPlus<L, R> const& a)
{
  s.reserve(s.size() + a.size());
  s += a.l;
  s += a.r;
  return s;
}